

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O0

int FindDiffVars(int *pDiffVars,Cube *pC1,Cube *pC2)

{
  uint uVar1;
  long lVar2;
  int local_30;
  int local_2c;
  int v;
  int i;
  Cube *pC2_local;
  Cube *pC1_local;
  int *pDiffVars_local;
  
  DiffVarCounter = 0;
  local_2c = 0;
  do {
    if (g_CoverInfo.nWordsOut <= local_2c) {
LAB_0038e6d7:
      local_2c = 0;
      while( true ) {
        if (g_CoverInfo.nWordsIn <= local_2c) {
          return DiffVarCounter;
        }
        Temp1 = pC1->pCubeDataIn[local_2c] ^ pC2->pCubeDataIn[local_2c];
        uVar1 = Temp1 | Temp1 >> 1;
        Temp2 = uVar1 & 0x55555555;
        Temp = uVar1 & 0x5555;
        cVars = (int)BitCount[Temp];
        if (cVars != 0) {
          if (4 < (uint)cVars) {
            return 5;
          }
          for (local_30 = 0; local_30 < cVars; local_30 = local_30 + 1) {
            if (BitGroupNumbers[Temp] == 200) {
              __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                            ,0x157,"int FindDiffVars(int *, Cube *, Cube *)");
            }
            lVar2 = (long)DiffVarCounter;
            DiffVarCounter = DiffVarCounter + 1;
            pDiffVars[lVar2] =
                 local_2c * 0x10 + (uint)GroupLiterals[BitGroupNumbers[Temp]][local_30];
          }
        }
        if (4 < DiffVarCounter) {
          return 5;
        }
        Temp = Temp2 >> 0x10;
        cVars = (int)BitCount[Temp];
        if (cVars != 0) {
          if (4 < (uint)cVars) {
            return 5;
          }
          for (local_30 = 0; local_30 < cVars; local_30 = local_30 + 1) {
            if (BitGroupNumbers[Temp] == 200) {
              __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                            ,0x168,"int FindDiffVars(int *, Cube *, Cube *)");
            }
            lVar2 = (long)DiffVarCounter;
            DiffVarCounter = DiffVarCounter + 1;
            pDiffVars[lVar2] =
                 local_2c * 0x10 + 8 + (uint)GroupLiterals[BitGroupNumbers[Temp]][local_30];
          }
        }
        if (4 < DiffVarCounter) break;
        local_2c = local_2c + 1;
      }
      return 5;
    }
    if (pC1->pCubeDataOut[local_2c] != pC2->pCubeDataOut[local_2c]) {
      *pDiffVars = -1;
      DiffVarCounter = 1;
      goto LAB_0038e6d7;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int FindDiffVars( int * pDiffVars, Cube * pC1, Cube * pC2 )
// determine different variables in two cubes and 
// writes them into pDiffVars[]
// -1 is written into pDiffVars[0] if the cubes have different outputs
// returns the number of different variables (including the output)
{
    int i, v;
    DiffVarCounter = 0;
    // check whether the output parts of the cubes are different

    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
        if ( pC1->pCubeDataOut[i] != pC2->pCubeDataOut[i] )
        { // they are different
            pDiffVars[0] = -1;
            DiffVarCounter = 1;
            break;
        }

    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
    {

        Temp1 = pC1->pCubeDataIn[i] ^ pC2->pCubeDataIn[i];
        Temp2 = (Temp1|(Temp1>>1)) & DIFFERENT;

        // check the first part of this word
        Temp = Temp2 & 0xffff;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;

        // check the second part of this word
        Temp = Temp2 >> 16;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + 8 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;
    }
    return DiffVarCounter;
}